

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapDynamicObject(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  ScriptContext *ctx;
  DynamicObject *rcObj;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  snpObject_local = (SnapObject *)ReuseObjectCheckAndReset(snpObject,inflator);
  if (snpObject_local == (SnapObject *)0x0) {
    this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
    this_00 = Js::ScriptContext::GetLibrary(this);
    snpObject_local = (SnapObject *)Js::JavascriptLibrary::CreateObject(this_00,false,0);
  }
  return (RecyclableObject *)snpObject_local;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapDynamicObject(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::DynamicObject* rcObj = ReuseObjectCheckAndReset(snpObject, inflator);
            if(rcObj != nullptr)
            {
                return rcObj;
            }
            else
            {
                Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
                return ctx->GetLibrary()->CreateObject();
            }
        }